

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O1

void __thiscall APowerSpeed::DoEffect(APowerSpeed *this)

{
  byte *pbVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  AInventory *pAVar5;
  PClass *pPVar6;
  int iVar7;
  undefined4 extraout_var;
  PClass *pPVar8;
  AActor *pAVar9;
  AActor *pAVar10;
  AActor *pAVar11;
  AInventory *pAVar12;
  bool bVar13;
  DVector3 local_38;
  
  APowerup::DoEffect(&this->super_APowerup);
  pAVar9 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
  if (pAVar9 != (AActor *)0x0) {
    if (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if ((((((this->super_APowerup).super_AInventory.Owner.field_0.p)->player != (player_t *)0x0)
           && ((((this->super_APowerup).super_AInventory.Owner.field_0.p)->player->cheats & 0x2000)
               == 0)) && ((this->SpeedFlags & 1) == 0)) && (((byte)level.time & 1) == 0)) {
        pAVar5 = (this->super_APowerup).super_AInventory.super_AActor.Inventory.field_0.p;
        if ((pAVar5 != (AInventory *)0x0) &&
           (((pAVar5->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
          (this->super_APowerup).super_AInventory.super_AActor.Inventory.field_0.p =
               (AInventory *)0x0;
          pAVar5 = (AInventory *)0x0;
        }
        while (pAVar12 = pAVar5, pPVar6 = RegistrationInfo.MyClass, pAVar12 != (AInventory *)0x0) {
          if ((pAVar12->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
            iVar7 = (**(pAVar12->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar12);
            (pAVar12->super_AActor).super_DThinker.super_DObject.Class =
                 (PClass *)CONCAT44(extraout_var,iVar7);
          }
          pPVar8 = (pAVar12->super_AActor).super_DThinker.super_DObject.Class;
          bVar13 = pPVar8 != (PClass *)0x0;
          if (pPVar8 != pPVar6 && bVar13) {
            do {
              pPVar8 = pPVar8->ParentClass;
              bVar13 = pPVar8 != (PClass *)0x0;
              if (pPVar8 == pPVar6) break;
            } while (pPVar8 != (PClass *)0x0);
          }
          if ((bVar13) &&
             (((ulong)pAVar12[1].super_AActor.super_DThinker.super_DObject.ObjNext & 1) == 0)) {
            if (pAVar12 != (AInventory *)0x0) {
              return;
            }
            break;
          }
          pAVar5 = (pAVar12->super_AActor).Inventory.field_0.p;
          if ((pAVar5 != (AInventory *)0x0) &&
             (((pAVar5->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
            (pAVar12->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
            pAVar5 = (AInventory *)0x0;
          }
        }
        pAVar9 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
        dVar2 = (pAVar9->Vel).X;
        dVar3 = (pAVar9->Vel).Y;
        dVar4 = (pAVar9->Vel).Z;
        if (144.0 < dVar4 * dVar4 + dVar3 * dVar3 + dVar2 * dVar2) {
          pAVar9 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
          local_38.X = (pAVar9->__Pos).X;
          local_38.Y = (pAVar9->__Pos).Y;
          local_38.Z = (pAVar9->__Pos).Z;
          pAVar9 = AActor::StaticSpawn((PClassActor *)APlayerSpeedTrail::RegistrationInfo.MyClass,
                                       &local_38,NO_REPLACE,false);
          if (pAVar9 != (AActor *)0x0) {
            (pAVar9->Angles).Yaw.Degrees =
                 (((this->super_APowerup).super_AInventory.Owner.field_0.p)->Angles).Yaw.Degrees;
            pAVar9->Translation =
                 ((this->super_APowerup).super_AInventory.Owner.field_0.p)->Translation;
            (pAVar9->target).field_0 = (this->super_APowerup).super_AInventory.Owner.field_0;
            pAVar9->sprite = ((this->super_APowerup).super_AInventory.Owner.field_0.p)->sprite;
            pAVar9->frame = ((this->super_APowerup).super_AInventory.Owner.field_0.p)->frame;
            pAVar9->Floorclip = ((this->super_APowerup).super_AInventory.Owner.field_0.p)->Floorclip
            ;
            pAVar10 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
            (pAVar9->Scale).Y = (pAVar10->Scale).Y;
            (pAVar9->Scale).X = (pAVar10->Scale).X;
            pAVar10 = (AActor *)(&DAT_00a39408)[(long)consoleplayer * 0x54];
            if ((pAVar10 != (AActor *)0x0) &&
               (((pAVar10->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
              (&DAT_00a39408)[(long)consoleplayer * 0x54] = 0;
              pAVar10 = (AActor *)0x0;
            }
            pAVar11 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
            if ((pAVar11 != (AActor *)0x0) &&
               (((pAVar11->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
              (this->super_APowerup).super_AInventory.Owner.field_0.p = (AActor *)0x0;
              pAVar11 = (AActor *)0x0;
            }
            if ((pAVar11 == pAVar10) &&
               ((((this->super_APowerup).super_AInventory.Owner.field_0.p)->player->cheats & 0x20)
                == 0)) {
              pbVar1 = (byte *)((long)&(pAVar9->renderflags).Value + 1);
              *pbVar1 = *pbVar1 | 0x80;
            }
          }
        }
      }
    }
    else {
      (this->super_APowerup).super_AInventory.Owner.field_0.p = (AActor *)0x0;
    }
  }
  return;
}

Assistant:

void APowerSpeed::DoEffect ()
{
	Super::DoEffect ();
	
	if (Owner == NULL || Owner->player == NULL)
		return;

	if (Owner->player->cheats & CF_PREDICTING)
		return;

	if (SpeedFlags & PSF_NOTRAIL)
		return;

	if (level.time & 1)
		return;

	// Check if another speed item is present to avoid multiple drawing of the speed trail.
	// Only the last PowerSpeed without PSF_NOTRAIL set will actually draw the trail.
	for (AInventory *item = Inventory; item != NULL; item = item->Inventory)
	{
		if (item->IsKindOf(RUNTIME_CLASS(APowerSpeed)) &&
			!(static_cast<APowerSpeed *>(item)->SpeedFlags & PSF_NOTRAIL))
		{
			return;
		}
	}

	if (Owner->Vel.LengthSquared() <= 12*12)
		return;

	AActor *speedMo = Spawn<APlayerSpeedTrail> (Owner->Pos(), NO_REPLACE);
	if (speedMo)
	{
		speedMo->Angles.Yaw = Owner->Angles.Yaw;
		speedMo->Translation = Owner->Translation;
		speedMo->target = Owner;
		speedMo->sprite = Owner->sprite;
		speedMo->frame = Owner->frame;
		speedMo->Floorclip = Owner->Floorclip;

		// [BC] Also get the scale from the owner.
		speedMo->Scale = Owner->Scale;

		if (Owner == players[consoleplayer].camera &&
			!(Owner->player->cheats & CF_CHASECAM))
		{
			speedMo->renderflags |= RF_INVISIBLE;
		}
	}
}